

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1557.c
# Opt level: O3

int test(char *URL)

{
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  undefined8 uVar6;
  char *pcVar7;
  undefined8 uVar8;
  int running_handles;
  int local_2c;
  
  local_2c = 0;
  iVar1 = curl_global_init(3);
  uVar8 = _stderr;
  if (iVar1 != 0) {
    uVar2 = curl_easy_strerror(iVar1);
    curl_mfprintf(uVar8,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1557.c"
                  ,0x24,iVar1,uVar2);
    return iVar1;
  }
  lVar3 = curl_multi_init();
  if (lVar3 == 0) {
    curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1557.c"
                  ,0x26);
    iVar1 = 0x7b;
  }
  else {
    iVar1 = curl_multi_setopt(lVar3,7,1);
    uVar8 = _stderr;
    if (iVar1 == 0) {
      lVar4 = curl_easy_init();
      if (lVar4 != 0) {
        iVar1 = curl_easy_setopt(lVar4,0x2712,URL);
        uVar8 = _stderr;
        if (iVar1 == 0) {
          iVar1 = curl_multi_add_handle(lVar3,lVar4);
          uVar8 = _stderr;
          if (iVar1 == 0) {
            lVar5 = curl_easy_init();
            if (lVar5 == 0) {
              lVar5 = 0;
              curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1557.c"
                            ,0x2d);
              iVar1 = 0x7c;
              goto LAB_0010235f;
            }
            iVar1 = curl_easy_setopt(lVar5,0x2712,URL);
            uVar8 = _stderr;
            if (iVar1 == 0) {
              iVar1 = curl_multi_add_handle(lVar3,lVar5);
              uVar8 = _stderr;
              if (iVar1 == 0) {
                iVar1 = curl_multi_perform(lVar3,&local_2c);
                uVar8 = _stderr;
                if (iVar1 == 0) {
                  if (local_2c < 0) {
                    curl_mfprintf(_stderr,
                                  "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1557.c"
                                  ,0x31);
                    iVar1 = 0x7a;
                    goto LAB_0010235f;
                  }
                  iVar1 = curl_multi_remove_handle(lVar3,lVar5);
                  uVar8 = _stderr;
                  if (iVar1 == 0) {
                    iVar1 = curl_multi_remove_handle(lVar3,lVar4);
                    uVar8 = _stderr;
                    if (iVar1 == 0) {
                      iVar1 = 0;
                      goto LAB_0010235f;
                    }
                    uVar2 = curl_multi_strerror(iVar1);
                    pcVar7 = "%s:%d curl_multi_remove_handle() failed, with code %d (%s)\n";
                    uVar6 = 0x36;
                  }
                  else {
                    uVar2 = curl_multi_strerror(iVar1);
                    pcVar7 = "%s:%d curl_multi_remove_handle() failed, with code %d (%s)\n";
                    uVar6 = 0x33;
                  }
                }
                else {
                  uVar2 = curl_multi_strerror(iVar1);
                  pcVar7 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
                  uVar6 = 0x31;
                }
              }
              else {
                uVar2 = curl_multi_strerror(iVar1);
                pcVar7 = "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n";
                uVar6 = 0x2f;
              }
            }
            else {
              uVar2 = curl_easy_strerror(iVar1);
              pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
              uVar6 = 0x2e;
            }
          }
          else {
            uVar2 = curl_multi_strerror(iVar1);
            pcVar7 = "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n";
            lVar5 = 0;
            uVar6 = 0x2b;
          }
        }
        else {
          uVar2 = curl_easy_strerror(iVar1);
          pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
          lVar5 = 0;
          uVar6 = 0x2a;
        }
        curl_mfprintf(uVar8,pcVar7,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1557.c"
                      ,uVar6,iVar1,uVar2);
        goto LAB_0010235f;
      }
      curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1557.c"
                    ,0x29);
      iVar1 = 0x7c;
    }
    else {
      uVar2 = curl_multi_strerror(iVar1);
      curl_mfprintf(uVar8,"%s:%d curl_multi_setopt() failed, with code %d (%s)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1557.c"
                    ,0x27,iVar1,uVar2);
    }
  }
  lVar5 = 0;
  lVar4 = 0;
LAB_0010235f:
  curl_easy_cleanup(lVar4);
  curl_easy_cleanup(lVar5);
  curl_multi_cleanup(lVar3);
  curl_global_cleanup();
  return iVar1;
}

Assistant:

int test(char *URL)
{
  CURLM *curlm = NULL;
  CURL *curl1 = NULL;
  CURL *curl2 = NULL;
  int running_handles = 0;
  int res = 0;

  global_init(CURL_GLOBAL_ALL);

  multi_init(curlm);
  multi_setopt(curlm, CURLMOPT_MAX_HOST_CONNECTIONS, 1);

  easy_init(curl1);
  easy_setopt(curl1, CURLOPT_URL, URL);
  multi_add_handle(curlm, curl1);

  easy_init(curl2);
  easy_setopt(curl2, CURLOPT_URL, URL);
  multi_add_handle(curlm, curl2);

  multi_perform(curlm, &running_handles);

  multi_remove_handle(curlm, curl2);

  /* If curl2 is still in the connect-pending list, this will crash */
  multi_remove_handle(curlm, curl1);

test_cleanup:
  curl_easy_cleanup(curl1);
  curl_easy_cleanup(curl2);
  curl_multi_cleanup(curlm);
  curl_global_cleanup();
  return res;
}